

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPML_DIGEST_VALUES_Unmarshal(TPML_DIGEST_VALUES *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  ulong uVar4;
  TPMT_HA *target_00;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    UVar2 = ByteArrayToUint32(*buffer);
    target->count = UVar2;
    *buffer = *buffer + 4;
    uVar4 = (ulong)target->count;
    TVar3 = 0x95;
    if (uVar4 < 5) {
      if (uVar4 != 0) {
        target_00 = target->digests;
        do {
          TVar3 = TPMT_HA_Unmarshal(target_00,buffer,size,0);
          if (TVar3 != 0) {
            return TVar3;
          }
          target_00 = target_00 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      TVar3 = 0;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPML_DIGEST_VALUES_Unmarshal(TPML_DIGEST_VALUES *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > HASH_COUNT)
        return TPM_RC_SIZE;
    result = TPMT_HA_Array_Unmarshal((TPMT_HA *)(target->digests), buffer, size, 0, (INT32)(target->count));
    return result;
}